

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

void __thiscall
cfd::js::api::json::CheckTweakedSchnorrPubkeyRequest::ConvertFromStruct
          (CheckTweakedSchnorrPubkeyRequest *this,CheckTweakedSchnorrPubkeyRequestStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->pubkey_);
  this->parity_ = data->parity;
  std::__cxx11::string::_M_assign((string *)&this->base_pubkey_);
  std::__cxx11::string::_M_assign((string *)&this->tweak_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void CheckTweakedSchnorrPubkeyRequest::ConvertFromStruct(
    const CheckTweakedSchnorrPubkeyRequestStruct& data) {
  pubkey_ = data.pubkey;
  parity_ = data.parity;
  base_pubkey_ = data.base_pubkey;
  tweak_ = data.tweak;
  ignore_items = data.ignore_items;
}